

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O1

void io::detail::parse_line<io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>>
               (char *line,char **sorted_col,vector<int,_std::allocator<int>_> *col_order)

{
  undefined8 *__s;
  pointer_____offset_0x10___ *ppuVar1;
  ulong uVar2;
  char *local_48;
  char *line_local;
  char *col_begin;
  char *col_end;
  
  local_48 = line;
  if ((col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar2 = 0;
    do {
      if (local_48 == (char *)0x0) {
        __s = (undefined8 *)__cxa_allocate_exception(0x210);
        memset(__s,0,0x210);
        *__s = &PTR__exception_001206e0;
        memset(__s + 0x21,0,0x100);
        *(undefined4 *)(__s + 0x41) = 0xffffffff;
        *__s = &PTR__exception_00120aa8;
        ppuVar1 = &error::too_few_columns::typeinfo;
        goto LAB_001162a1;
      }
      chop_next_column<io::no_quote_escape<(char)44>>(&local_48,&line_local,&col_begin);
      if ((col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_start[uVar2] != -1) {
        for (; ((*line_local == ' ' || (*line_local == '\t')) && (line_local != col_begin));
            line_local = line_local + 1) {
        }
        for (; ((col_begin[-1] == ' ' || (col_begin[-1] == '\t')) && (col_begin != line_local));
            col_begin = col_begin + -1) {
        }
        *col_begin = '\0';
        sorted_col
        [(col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start[uVar2]] = line_local;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(col_order->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(col_order->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_48 == (char *)0x0) {
    return;
  }
  __s = (undefined8 *)__cxa_allocate_exception(0x210);
  memset(__s,0,0x210);
  *__s = &PTR__exception_001206e0;
  memset(__s + 0x21,0,0x100);
  *(undefined4 *)(__s + 0x41) = 0xffffffff;
  *__s = &PTR__exception_00120ad8;
  ppuVar1 = &error::too_many_columns::typeinfo;
LAB_001162a1:
  __cxa_throw(__s,ppuVar1,std::exception::~exception);
}

Assistant:

void parse_line(
                        char*line,
                        char**sorted_col,
                        const std::vector<int>&col_order
                ){
                        for(std::size_t i=0; i<col_order.size(); ++i){
                                if(line == nullptr)
                                        throw ::io::error::too_few_columns();
                                char*col_begin, *col_end;
                                chop_next_column<quote_policy>(line, col_begin, col_end);

                                if(col_order[i] != -1){
                                        trim_policy::trim(col_begin, col_end);
                                        quote_policy::unescape(col_begin, col_end);
                                                               
                                        sorted_col[col_order[i]] = col_begin;
                                }
                        }
                        if(line != nullptr)
                                throw ::io::error::too_many_columns();
                }